

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTFusionRTQF.cpp
# Opt level: O0

void __thiscall
RTFusionRTQF::newIMUData(RTFusionRTQF *this,RTIMU_DATA *data,RTIMUSettings *settings)

{
  char *pcVar1;
  float local_3c;
  RTVector3 local_2c;
  RTIMUSettings *local_20;
  RTIMUSettings *settings_local;
  RTIMU_DATA *data_local;
  RTFusionRTQF *this_local;
  
  local_20 = settings;
  settings_local = (RTIMUSettings *)data;
  data_local = (RTIMU_DATA *)this;
  if (((this->super_RTFusion).m_debug & 1U) != 0) {
    printf("%s","\n------\n");
    fflush(_stdout);
    this->m_sampleNumber = this->m_sampleNumber + 1;
    printf("IMU update delta time: %f, sample %d\n",(double)this->m_timeDelta);
    fflush(_stdout);
  }
  this->m_sampleNumber = this->m_sampleNumber + 1;
  if (((this->super_RTFusion).m_enableGyro & 1U) == 0) {
    RTVector3::RTVector3(&local_2c);
    RTVector3::operator=(&this->m_gyro,&local_2c);
  }
  else {
    RTVector3::operator=(&this->m_gyro,(RTVector3 *)&settings_local->m_I2CPressureAddress);
  }
  RTVector3::operator=
            (&(this->super_RTFusion).m_accel,
             (RTVector3 *)((settings_local->m_compassCalMin).m_data + 1));
  RTVector3::operator=
            (&(this->super_RTFusion).m_compass,
             (RTVector3 *)((settings_local->m_compassCalMax).m_data + 2));
  (this->super_RTFusion).m_compassValid =
       (bool)(*(byte *)((settings_local->m_compassCalMax).m_data + 1) & 1);
  if (((this->super_RTFusion).m_firstTime & 1U) == 0) {
    local_3c = (float)((long)(settings_local->super_RTIMUHal)._vptr_RTIMUHal -
                      (this->super_RTFusion).m_lastFusionTime);
    this->m_timeDelta = local_3c / 1e+06;
    (this->super_RTFusion).m_lastFusionTime =
         (uint64_t)(settings_local->super_RTIMUHal)._vptr_RTIMUHal;
    if (this->m_timeDelta <= 0.0) {
      return;
    }
    RTFusion::calculatePose
              (&this->super_RTFusion,(RTVector3 *)((settings_local->m_compassCalMin).m_data + 1),
               (RTVector3 *)((settings_local->m_compassCalMax).m_data + 2),
               local_20->m_compassAdjDeclination);
    predict(this);
    update(this);
    RTQuaternion::toEuler(&this->m_stateQ,&(this->super_RTFusion).m_fusionPose);
    RTQuaternion::operator=(&(this->super_RTFusion).m_fusionQPose,&this->m_stateQ);
    if (((this->super_RTFusion).m_debug & 1U) != 0) {
      pcVar1 = RTMath::displayRadians("Measured pose",&(this->super_RTFusion).m_measuredPose);
      printf("%s",pcVar1);
      fflush(_stdout);
      pcVar1 = RTMath::displayRadians("RTQF pose",&(this->super_RTFusion).m_fusionPose);
      printf("%s",pcVar1);
      fflush(_stdout);
      pcVar1 = RTMath::displayRadians("Measured quat",&(this->super_RTFusion).m_measuredPose);
      printf("%s",pcVar1);
      fflush(_stdout);
      pcVar1 = RTMath::display("RTQF quat",&this->m_stateQ);
      printf("%s",pcVar1);
      fflush(_stdout);
      pcVar1 = RTMath::display("Error quat",&this->m_stateQError);
      printf("%s",pcVar1);
      fflush(_stdout);
    }
  }
  else {
    (this->super_RTFusion).m_lastFusionTime =
         (uint64_t)(settings_local->super_RTIMUHal)._vptr_RTIMUHal;
    RTFusion::calculatePose
              (&this->super_RTFusion,&(this->super_RTFusion).m_accel,
               &(this->super_RTFusion).m_compass,local_20->m_compassAdjDeclination);
    RTQuaternion::fromEuler(&this->m_stateQ,&(this->super_RTFusion).m_measuredPose);
    RTQuaternion::operator=(&(this->super_RTFusion).m_fusionQPose,&this->m_stateQ);
    RTVector3::operator=
              (&(this->super_RTFusion).m_fusionPose,&(this->super_RTFusion).m_measuredPose);
    (this->super_RTFusion).m_firstTime = false;
  }
  (settings_local->super_RTIMUHal).m_busIsI2C = true;
  *(undefined1 *)&(settings_local->super_RTIMUHal).m_SPI = 1;
  RTVector3::operator=
            ((RTVector3 *)&(settings_local->super_RTIMUHal).m_SPISpeed,
             &(this->super_RTFusion).m_fusionPose);
  RTQuaternion::operator=
            ((RTQuaternion *)&(settings_local->super_RTIMUHal).field_0x1c,
             &(this->super_RTFusion).m_fusionQPose);
  return;
}

Assistant:

void RTFusionRTQF::newIMUData(RTIMU_DATA& data, const RTIMUSettings *settings)
{
    if (m_debug) {
        HAL_INFO("\n------\n");
        HAL_INFO2("IMU update delta time: %f, sample %d\n", m_timeDelta, m_sampleNumber++);
    }
    m_sampleNumber++;

    if (m_enableGyro)
        m_gyro = data.gyro;
    else
        m_gyro = RTVector3();
    m_accel = data.accel;
    m_compass = data.compass;
    m_compassValid = data.compassValid;

    if (m_firstTime) {
        m_lastFusionTime = data.timestamp;
        calculatePose(m_accel, m_compass, settings->m_compassAdjDeclination);

        //  initialize the poses

        m_stateQ.fromEuler(m_measuredPose);
        m_fusionQPose = m_stateQ;
        m_fusionPose = m_measuredPose;
        m_firstTime = false;
    } else {
        m_timeDelta = (RTFLOAT)(data.timestamp - m_lastFusionTime) / (RTFLOAT)1000000;
        m_lastFusionTime = data.timestamp;
        if (m_timeDelta <= 0)
            return;

        calculatePose(data.accel, data.compass, settings->m_compassAdjDeclination);

        predict();
        update();
        m_stateQ.toEuler(m_fusionPose);
        m_fusionQPose = m_stateQ;

        if (m_debug) {
            HAL_INFO(RTMath::displayRadians("Measured pose", m_measuredPose));
            HAL_INFO(RTMath::displayRadians("RTQF pose", m_fusionPose));
            HAL_INFO(RTMath::displayRadians("Measured quat", m_measuredPose));
            HAL_INFO(RTMath::display("RTQF quat", m_stateQ));
            HAL_INFO(RTMath::display("Error quat", m_stateQError));
         }
    }
    data.fusionPoseValid = true;
    data.fusionQPoseValid = true;
    data.fusionPose = m_fusionPose;
    data.fusionQPose = m_fusionQPose;
}